

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void noise_suppression(char *in_file,char *out_file)

{
  int16_t *__ptr;
  uint64_t *in_RSI;
  uint32_t *in_RDI;
  double start;
  double end;
  double dVar1;
  char *unaff_retaddr;
  double time_interval;
  double startTime;
  int16_t *inBuffer;
  uint64_t inSampleCount;
  uint32_t channels;
  uint32_t sampleRate;
  uint32_t channels_00;
  int sampleRate_00;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  sampleRate_00 = 0;
  __ptr = wavRead_int16(unaff_retaddr,in_RDI,in_RSI,(uint32_t *)0x0);
  if (__ptr != (int16_t *)0x0) {
    start = now();
    nsProcess((int16_t *)out_file,sampleRate,inSampleCount,inBuffer._4_4_,(nsLevel)inBuffer);
    dVar1 = start;
    end = now();
    channels_00 = (uint32_t)((ulong)dVar1 >> 0x20);
    dVar1 = calcElapsed(start,end);
    printf("time interval: %d ms\n ",(ulong)(uint)(int)(dVar1 * 1000.0));
    wavWrite_int16((char *)in_RSI,(int16_t *)CONCAT44(uVar3,uVar2),sampleRate_00,(uint64_t)__ptr,
                   channels_00);
    free(__ptr);
  }
  return;
}

Assistant:

void noise_suppression(char *in_file, char *out_file) {
    //音频采样率
    uint32_t sampleRate = 0;
    uint32_t channels = 0;
    //总音频采样数
    uint64_t inSampleCount = 0;
    int16_t *inBuffer = wavRead_int16(in_file, &sampleRate, &inSampleCount, &channels);

    //如果加载成功
    if (inBuffer != nullptr) {
        double startTime = now();
        nsProcess(inBuffer, sampleRate, inSampleCount, channels, kModerate);
        double time_interval = calcElapsed(startTime, now());
        printf("time interval: %d ms\n ", (int) (time_interval * 1000));


        wavWrite_int16(out_file, inBuffer, sampleRate, inSampleCount, channels);
        free(inBuffer);
    }
}